

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_And(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Man_t *local_40;
  Ivy_Man_t *local_38;
  Ivy_Obj_t *p1_local;
  Ivy_Obj_t *p0_local;
  Ivy_Man_t *p_local;
  
  p_local = (Ivy_Man_t *)p0;
  if (p0 != p1) {
    pIVar1 = Ivy_Not(p1);
    if (p0 == pIVar1) {
      p_local = (Ivy_Man_t *)Ivy_Not(p->pConst1);
    }
    else {
      pIVar1 = Ivy_Regular(p0);
      if (pIVar1 == p->pConst1) {
        local_38 = (Ivy_Man_t *)p1;
        if (p0 != p->pConst1) {
          local_38 = (Ivy_Man_t *)Ivy_Not(p->pConst1);
        }
        p_local = local_38;
      }
      else {
        pIVar1 = Ivy_Regular(p1);
        if (pIVar1 == p->pConst1) {
          local_40 = (Ivy_Man_t *)p0;
          if (p1 != p->pConst1) {
            local_40 = (Ivy_Man_t *)Ivy_Not(p->pConst1);
          }
          p_local = local_40;
        }
        else {
          p_local = (Ivy_Man_t *)Ivy_CanonAnd(p,p0,p1);
        }
      }
    }
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_And( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1 )
{
//    Ivy_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Ivy_Not(p->pConst1);
    if ( Ivy_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Ivy_Not(p->pConst1);
    // check if it can be an EXOR gate
//    if ( Ivy_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
//        return Ivy_CanonExor( pFan0, pFan1 );
    return Ivy_CanonAnd( p, p0, p1 );
}